

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

UniValue *
RPCConvertValues(string *strMethod,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *strParams)

{
  long lVar1;
  string_view arg_value;
  UniValue *val;
  UniValue *pUVar2;
  CRPCConvertTable *in_RDX;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  __sv_type _Var3;
  uint idx;
  UniValue *params;
  string_view value;
  UniValue *in_stack_fffffffffffffef8;
  size_type in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff08;
  UniValue *this;
  undefined4 local_d8;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 uVar4;
  size_t in_stack_ffffffffffffff68;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 0;
  this = in_RDI;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  UniValue::UniValue(this,(VType)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffef8);
  local_d8 = 0;
  while( true ) {
    val = (UniValue *)(ulong)local_d8;
    pUVar2 = (UniValue *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffef8);
    if (pUVar2 <= val) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)val,in_stack_ffffffffffffff00);
    _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    arg_value._M_str = (char *)_Var3._M_len;
    arg_value._M_len = in_stack_ffffffffffffff68;
    CRPCConvertTable::ArgToUniValue
              (in_RDX,arg_value,(string *)CONCAT17(uVar4,in_stack_ffffffffffffff38),
               _Var3._M_str._4_4_);
    UniValue::push_back(in_RDI,val);
    UniValue::~UniValue(in_stack_fffffffffffffef8);
    local_d8 = local_d8 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

UniValue RPCConvertValues(const std::string &strMethod, const std::vector<std::string> &strParams)
{
    UniValue params(UniValue::VARR);

    for (unsigned int idx = 0; idx < strParams.size(); idx++) {
        std::string_view value{strParams[idx]};
        params.push_back(rpcCvtTable.ArgToUniValue(value, strMethod, idx));
    }

    return params;
}